

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O2

int __thiscall ArmParser::decodeCondition(ArmParser *this,string *text,size_t *pos)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  pointer pcVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  sVar3 = *pos;
  if (text->_M_string_length < sVar3 + 2) {
    return 0xe;
  }
  pcVar4 = (text->_M_dataplus)._M_p;
  bVar1 = pcVar4[sVar3];
  bVar2 = pcVar4[sVar3 + 1];
  *pos = sVar3 + 2;
  iVar5 = 0;
  if (bVar2 != 0x71 || bVar1 != 0x65) {
    bVar6 = bVar2 ^ 0x65;
    if (bVar1 == 0x6e && bVar6 == 0) {
      iVar5 = 1;
    }
    else {
      bVar7 = bVar2 ^ 0x73;
      iVar5 = 2;
      if (((bVar1 ^ 99) != 0 || bVar7 != 0) && ((bVar1 ^ 0x68) != 0 || bVar7 != 0)) {
        iVar5 = 3;
        if (((bVar1 ^ 99) != 0 || (bVar2 ^ 99) != 0) &&
           (bVar8 = bVar1 ^ 0x6c, bVar2 != 0x6f || bVar8 != 0)) {
          if (bVar1 == 0x6d && (bVar2 ^ 0x69) == 0) {
            iVar5 = 4;
          }
          else if (bVar1 == 0x70 && (bVar2 ^ 0x6c) == 0) {
            iVar5 = 5;
          }
          else if ((bVar1 ^ 0x76) == 0 && bVar7 == 0) {
            iVar5 = 6;
          }
          else if ((bVar1 ^ 0x76) == 0 && (bVar2 ^ 99) == 0) {
            iVar5 = 7;
          }
          else if ((bVar1 ^ 0x68) == 0 && (bVar2 ^ 0x69) == 0) {
            iVar5 = 8;
          }
          else if (bVar7 == 0 && bVar8 == 0) {
            iVar5 = 9;
          }
          else if ((bVar1 ^ 0x67) == 0 && bVar6 == 0) {
            iVar5 = 10;
          }
          else if (bVar8 == 0 && (bVar2 ^ 0x74) == 0) {
            iVar5 = 0xb;
          }
          else if ((bVar1 ^ 0x67) == 0 && (bVar2 ^ 0x74) == 0) {
            iVar5 = 0xc;
          }
          else if (bVar8 == 0 && bVar6 == 0) {
            iVar5 = 0xd;
          }
          else {
            if (bVar1 != 0x61 || (bVar2 ^ 0x6c) != 0) {
              *pos = sVar3;
            }
            iVar5 = 0xe;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int ArmParser::decodeCondition(const std::string& text, size_t& pos)
{
	if (pos+2 <= text.size())
	{
		char c1 = text[pos+0];
		char c2 = text[pos+1];
		pos += 2;

		if (c1 == 'e' && c2 == 'q') return 0;
		if (c1 == 'n' && c2 == 'e') return 1;
		if (c1 == 'c' && c2 == 's') return 2;
		if (c1 == 'h' && c2 == 's') return 2;
		if (c1 == 'c' && c2 == 'c') return 3;
		if (c1 == 'l' && c2 == 'o') return 3;
		if (c1 == 'm' && c2 == 'i') return 4;
		if (c1 == 'p' && c2 == 'l') return 5;
		if (c1 == 'v' && c2 == 's') return 6;
		if (c1 == 'v' && c2 == 'c') return 7;
		if (c1 == 'h' && c2 == 'i') return 8;
		if (c1 == 'l' && c2 == 's') return 9;
		if (c1 == 'g' && c2 == 'e') return 10;
		if (c1 == 'l' && c2 == 't') return 11;
		if (c1 == 'g' && c2 == 't') return 12;
		if (c1 == 'l' && c2 == 'e') return 13;
		if (c1 == 'a' && c2 == 'l') return 14;

		pos -= 2;
	}

	return 14;
}